

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboCases::ResizeTest::render
          (ResizeTest *this,Context *context,Surface *dst)

{
  FboConfig *config;
  DataType DVar1;
  DataType outputType;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int in_R9D;
  Vector<float,_4> res_1;
  Vec3 local_588;
  Framebuffer fbo;
  TextureFormat colorFormat;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  FlatColorShader flatShader;
  Texture2DShader texFromFboShader;
  Texture2DShader texToFboShader;
  
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  DVar1 = glu::getSampler2DType(colorFormat);
  outputType = FboTestUtil::getFragmentOutputType(&colorFormat);
  tcu::getTextureFormatInfo(&fboRangeInfo,&colorFormat);
  fboOutScale.m_data[0] = fboRangeInfo.valueMax.m_data[0] - fboRangeInfo.valueMin.m_data[0];
  fboOutScale.m_data[1] = fboRangeInfo.valueMax.m_data[1] - fboRangeInfo.valueMin.m_data[1];
  fboOutScale.m_data[2] = fboRangeInfo.valueMax.m_data[2] - fboRangeInfo.valueMin.m_data[2];
  fboOutScale.m_data[3] = fboRangeInfo.valueMax.m_data[3] - fboRangeInfo.valueMin.m_data[3];
  fboOutBias.m_data[1] = fboRangeInfo.valueMin.m_data[1];
  fboOutBias.m_data[0] = fboRangeInfo.valueMin.m_data[0];
  fboOutBias.m_data[3] = fboRangeInfo.valueMin.m_data[3];
  fboOutBias.m_data[2] = fboRangeInfo.valueMin.m_data[2];
  texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)
       CONCAT44(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_,0x28);
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&texFromFboShader,(iterator)0x0,
             (DataType *)&flatShader);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)0x3f8000003f800000;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  fbo.m_config.buffers = 0;
  fbo.m_config.colorType = 0;
  fbo.m_config.colorFormat = 0;
  fbo.m_config.depthStencilType = 0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,(DataTypes *)&texFromFboShader,outputType,(Vec4 *)&flatShader,
             (Vec4 *)&fbo);
  if (texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader !=
      (_func_int **)0x0) {
    operator_delete(texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
                   );
  }
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbo.m_config.buffers = DVar1;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&flatShader,(iterator)0x0,
             (DataType *)&fbo);
  fbo.m_config.buffers = 0x3f800000;
  fbo.m_config.colorType = 0x3f800000;
  fbo.m_config.colorFormat = 0x3f800000;
  fbo.m_config.depthStencilType = 0x3f800000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texFromFboShader,(DataTypes *)&flatShader,TYPE_FLOAT_VEC4,(Vec4 *)&fbo,&res_1);
  if (flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,outputType);
  program = (*context->_vptr_Context[0x75])(context,&texToFboShader);
  program_00 = (*context->_vptr_Context[0x75])(context,&texFromFboShader);
  program_01 = (*context->_vptr_Context[0x75])(context,&flatShader);
  config = &(this->super_FboRenderCase).m_config;
  uVar4 = config->buffers;
  FboTestUtil::Texture2DShader::setOutScaleBias(&texToFboShader,&fboOutScale,&fboOutBias);
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&texFromFboShader,0,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias);
  createQuadsTex2D(context,1,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(context,2,0x1907,0x20,0x20,in_R9D);
  Framebuffer::Framebuffer(&fbo,context,config,0x80,0x80,0,0,0);
  Framebuffer::checkCompleteness(&fbo);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,context,program);
  FboTestUtil::Texture2DShader::setUniforms(&texFromFboShader,context,program_00);
  res_1.m_data[1] = fboOutScale.m_data[1] * 1.0 + fboOutBias.m_data[1];
  res_1.m_data[0] = fboOutScale.m_data[0] * 0.0 + fboOutBias.m_data[0];
  res_1.m_data[3] = fboOutScale.m_data[3] * 1.0 + fboOutBias.m_data[3];
  res_1.m_data[2] = fboOutScale.m_data[2] * 0.0 + fboOutBias.m_data[2];
  FboTestUtil::FlatColorShader::setColor(&flatShader,context,program_01,&res_1);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 1.0;
  FboTestUtil::clearColorBuffer(context,&colorFormat,&res_1);
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[6])(context,0xde1,1);
  res_1.m_data[0] = -1.0;
  res_1.m_data[1] = -1.0;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  local_588.m_data[0] = 1.0;
  local_588.m_data[1] = 1.0;
  local_588.m_data[2] = 0.0;
  sglr::drawQuad(context,program,(Vec3 *)&res_1,&local_588);
  if (fbo.m_config.colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar2 = (*context->_vptr_Context[2])(context);
    uVar3 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar2,(ulong)uVar3);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    res_1.m_data[0] = -1.0;
    res_1.m_data[1] = -1.0;
    res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
    local_588.m_data[0] = 1.0;
    local_588.m_data[1] = 1.0;
    local_588.m_data[2] = 0.0;
    sglr::drawQuad(context,program_00,(Vec3 *)&res_1,&local_588);
    (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  }
  if (fbo.m_config.colorType == 0x8d41) {
    (*context->_vptr_Context[0xc])(context,0x8d41,(ulong)fbo.m_colorBuffer);
    (*context->_vptr_Context[0x23])(context,0x8d41,fbo.m_config._8_8_ & 0xffffffff,0x40,0x20);
  }
  else if (fbo.m_config.colorType == 0xde1) {
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    (*context->_vptr_Context[0x7e])(context,0xde1,0,fbo.m_config._8_8_ & 0xffffffff,0x40,0x20);
  }
  if ((uVar4 & 0x500) != 0) {
    if (fbo.m_config.depthStencilType == 0x8d41) {
      (*context->_vptr_Context[0xc])(context,0x8d41,(ulong)fbo.m_depthStencilBuffer);
      (*context->_vptr_Context[0x23])
                (context,0x8d41,(ulong)fbo.m_config.depthStencilFormat,0x40,0x20);
    }
    else if (fbo.m_config.depthStencilType == 0xde1) {
      (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_depthStencilBuffer);
      (*context->_vptr_Context[0x7e])
                (context,0xde1,0,(ulong)fbo.m_config.depthStencilFormat,0x40,0x20);
    }
  }
  (*context->_vptr_Context[5])(context,0,0,0x40,0x20);
  res_1.m_data[0] = 1.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 1.0;
  FboTestUtil::clearColorBuffer(context,&colorFormat,&res_1);
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[0x33])(context,0xb71);
  (*context->_vptr_Context[6])(context,0xde1,2);
  res_1.m_data[0] = -1.0;
  res_1.m_data[1] = -1.0;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  local_588.m_data[0] = 1.0;
  local_588.m_data[1] = 1.0;
  local_588.m_data[2] = 0.0;
  sglr::drawQuad(context,program,(Vec3 *)&res_1,&local_588);
  (*context->_vptr_Context[6])(context,0xde1,1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = -1.0;
  local_588.m_data._0_8_ = (undefined1 *)0x3f8000003f800000;
  local_588.m_data[2] = 1.0;
  sglr::drawQuad(context,program,(Vec3 *)&res_1,&local_588);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if ((uVar4 >> 10 & 1) != 0) {
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x32])(context,10,10,5,0xf);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    res_1.m_data[0] = -1.0;
    res_1.m_data[1] = -1.0;
    res_1.m_data[2] = 0.0;
    local_588.m_data._0_8_ = (undefined1 *)0x3f8000003f800000;
    local_588.m_data[2] = 0.0;
    sglr::drawQuad(context,program_01,(Vec3 *)&res_1,&local_588);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar4 = (*context->_vptr_Context[2])(context);
    uVar2 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar4,(ulong)uVar2);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    res_1.m_data[0] = -0.5;
    res_1.m_data[1] = -0.5;
    res_1.m_data[2] = 0.0;
    local_588.m_data._0_8_ = &DAT_3f0000003f000000;
    local_588.m_data[2] = 0.0;
    sglr::drawQuad(context,program_00,(Vec3 *)&res_1,&local_588);
    uVar4 = (*context->_vptr_Context[2])(context);
    uVar2 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar4,(ulong)uVar2);
  }
  else {
    FboTestUtil::readPixels
              (context,dst,0,0,0x40,0x20,&colorFormat,&fboRangeInfo.lookupScale,
               &fboRangeInfo.lookupBias);
  }
  Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texFromFboShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void ResizeTest::render (sglr::Context& context, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= context.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= context.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= context.createProgram(&flatShader);

	deUint32				quadsTex			= 1;
	deUint32				metaballsTex		= 2;
	bool					depth				= (m_config.buffers & GL_DEPTH_BUFFER_BIT)		!= 0;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT)	!= 0;
	int						initialWidth		= 128;
	int						initialHeight		= 128;
	int						newWidth			= 64;
	int						newHeight			= 32;

	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);

	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 32, 32);

	Framebuffer fbo(context, m_config, initialWidth, initialHeight);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setUniforms	(context, texToFboShaderID);
	texFromFboShader.setUniforms(context, texFromFboShaderID);
	flatShader.setColor			(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f) * fboOutScale + fboOutBias);

	// Render quads
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, initialWidth, initialHeight);
	clearColorBuffer(context, colorFormat, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Render fbo to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore binding
		context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	}

	// Resize buffers
	switch (fbo.getConfig().colorType)
	{
		case GL_TEXTURE_2D:
			context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
			context.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().colorFormat, newWidth, newHeight);
			break;

		case GL_RENDERBUFFER:
			context.bindRenderbuffer(GL_RENDERBUFFER, fbo.getColorBuffer());
			context.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().colorFormat, newWidth, newHeight);
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	if (depth || stencil)
	{
		switch (fbo.getConfig().depthStencilType)
		{
			case GL_TEXTURE_2D:
				context.bindTexture(GL_TEXTURE_2D, fbo.getDepthStencilBuffer());
				context.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().depthStencilFormat, newWidth, newHeight);
				break;

			case GL_RENDERBUFFER:
				context.bindRenderbuffer(GL_RENDERBUFFER, fbo.getDepthStencilBuffer());
				context.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().depthStencilFormat, newWidth, newHeight);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Render to resized fbo
	context.viewport(0, 0, newWidth, newHeight);
	clearColorBuffer(context, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_DEPTH_TEST);

	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(0.0f, 0.0f, -1.0f), Vec3(+1.0f, +1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		context.enable(GL_SCISSOR_TEST);
		context.clearStencil(1);
		context.scissor(10, 10, 5, 15);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (m_config.colorType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(0.5f, 0.5f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, newWidth, newHeight, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
}